

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O1

XPK * XPK_NewFromFile(FILE *f,LPStatus *status)

{
  ushort uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  _Bool _Var6;
  uint32_t uVar7;
  XPKEntry **ppXVar8;
  XPKEntry *pXVar9;
  long lVar10;
  uint32_t *puVar11;
  ulong uVar12;
  LPStatus LVar13;
  XPK *pXVar14;
  uint16_t y;
  uint16_t x;
  uint16_t height;
  uint16_t width;
  uint32_t offset;
  uint16_t local_4c;
  uint16_t local_4a;
  uint16_t local_48;
  uint16_t local_46;
  uint32_t local_44;
  LPStatus *local_40;
  XPK *local_38;
  
  _Var6 = ValidateMagicF(f,XPK_MAGIC,4);
  if (_Var6) {
    local_38 = (XPK *)malloc(0x30);
    if (local_38 != (XPK *)0x0) {
      local_38->clu = (CLU *)0x0;
      local_38->file = f;
      local_40 = status;
      ReadUint8(f,2,local_38->co2);
      ReadUint16(f,1,&local_38->n_entries);
      local_38->a = 0;
      fseek((FILE *)f,4,1);
      ReadUint32(f,1,&local_38->next_section);
      uVar1 = local_38->n_entries;
      ppXVar8 = (XPKEntry **)calloc((ulong)uVar1,0x20);
      local_38->entries = ppXVar8;
      if ((ulong)uVar1 != 0) {
        uVar12 = 0;
        do {
          fseek((FILE *)f,8,1);
          ReadUint16(f,1,&local_4a);
          ReadUint16(f,1,&local_4c);
          ReadUint16(f,1,&local_46);
          ReadUint16(f,1,&local_48);
          uVar5 = local_46;
          uVar4 = local_48;
          uVar3 = local_4a;
          uVar2 = local_4c;
          pXVar9 = (XPKEntry *)malloc(0x20);
          if (pXVar9 == (XPKEntry *)0x0) {
            pXVar9 = (XPKEntry *)0x0;
          }
          else {
            pXVar9->width = uVar5;
            pXVar9->height = uVar4;
            pXVar9->x = uVar3;
            pXVar9->y = uVar2;
            pXVar9->data = (void *)0x0;
          }
          pXVar9->xpk = local_38;
          local_38->entries[uVar12] = pXVar9;
          uVar12 = uVar12 + 1;
        } while (uVar12 < local_38->n_entries);
      }
      lVar10 = ftell((FILE *)f);
      pXVar14 = local_38;
      uVar1 = local_38->n_entries;
      puVar11 = (uint32_t *)calloc((ulong)uVar1,4);
      pXVar14->offsets = puVar11;
      LVar13 = LUNAPURPURA_OK;
      status = local_40;
      if ((ulong)uVar1 != 0) {
        uVar12 = 0;
        do {
          ReadUint32(f,1,&local_44);
          uVar7 = local_44 + (int)lVar10;
          pXVar14->offsets[uVar12] = uVar7;
          pXVar14->entries[uVar12]->offset = uVar7;
          uVar12 = uVar12 + 1;
          status = local_40;
        } while (uVar12 < pXVar14->n_entries);
      }
      goto LAB_00102d53;
    }
    LVar13 = LUNAPURPURA_ERROR;
  }
  else {
    LVar13 = LUNAPURPURA_BADMAGIC;
  }
  pXVar14 = (XPK *)0x0;
LAB_00102d53:
  *status = LVar13;
  return pXVar14;
}

Assistant:

XPK *
XPK_NewFromFile(FILE *f, LPStatus *status)
{
	if (!ValidateMagicF(f, XPK_MAGIC, XPK_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	XPK *xpk = malloc(sizeof(XPK));

	/* XXX should explain bad malloc */
	if (!xpk) {
		free(xpk);
		*status = LUNAPURPURA_ERROR;
		return NULL;
	}

	xpk->clu = NULL;
	xpk->file = f;

	ReadUint8(f, 2, xpk->co2);
	ReadUint16(f, 1, &xpk->n_entries);
	xpk->a = 0; /* XXX dunno */
	fseek(f, 4L, SEEK_CUR);
	ReadUint32(f, 1, &xpk->next_section);

	xpk->entries = calloc(xpk->n_entries, sizeof(XPKEntry));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint16_t width;
		uint16_t height;
		uint16_t x;
		uint16_t y;

		fseek(f, 8L, SEEK_CUR); /* Ignore first 4 numbers ("x1", "x2", "w1", "w2") */
		ReadUint16(f, 1, &x);
		ReadUint16(f, 1, &y);
		ReadUint16(f, 1, &width);
		ReadUint16(f, 1, &height);

		XPKEntry *entry = XPKEntry_New(width, height, x, y);
		entry->xpk = xpk;

		if (!entry) {
			*status = LUNAPURPURA_ERROR;
			fclose(f);
			return NULL;
		}

		xpk->entries[i] = entry;
	}

	/*
	 * The offsets which are listed in the XPK file are not absolute, they are
	 * relative to this position right here. But we'll go ahead and store the
	 * absolute offsets in the XPK struct we're trying to create. (Nothing
	 * wrong with that, right?)
	 *
	 * While generating this list, we'll enrich each of the XPKEntries we
	 * created earlier with this new info.
	 */
	uint32_t offsets_start_pos = ftell(f);

	/* XXX check for malloc error */
	xpk->offsets = calloc(xpk->n_entries, sizeof(uint32_t));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint32_t offset;
		ReadUint32(f, 1, &offset);
		uint32_t absolute_offset = offsets_start_pos + offset;
		xpk->offsets[i] = absolute_offset;
		xpk->entries[i]->offset = absolute_offset;
	}

	*status = LUNAPURPURA_OK;
	return xpk;
}